

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  
  bVar2 = InRealOneof(this,field);
  if (!bVar2) {
    uVar4 = GetFieldOffsetNonOneof(this,field);
    return uVar4;
  }
  pOVar1 = (field->scope_).containing_oneof;
  if (pOVar1 != (OneofDescriptor *)0x0) {
    if ((field->type_ < 0xd) && ((0x1a00U >> (field->type_ & 0x1f) & 1) != 0)) {
      uVar3 = this->offsets_
              [(long)field->containing_type_->field_count_ +
               (long)((int)((ulong)((long)pOVar1 - (long)pOVar1->containing_type_->oneof_decls_) >>
                           3) * -0x49249249)] & 0x7ffffffe;
    }
    else {
      uVar3 = this->offsets_
              [(long)field->containing_type_->field_count_ +
               (long)((int)((ulong)((long)pOVar1 - (long)pOVar1->containing_type_->oneof_decls_) >>
                           3) * -0x49249249)] & 0x7fffffff;
    }
    return uVar3;
  }
  protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb31);
}

Assistant:

uint32_t GetFieldOffset(const FieldDescriptor* field) const {
    if (InRealOneof(field)) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count()) +
          field->containing_oneof()->index();
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }